

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O1

bool s2shapeutil::FindSelfIntersection(S2ShapeIndex *index,S2Error *error)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  S2Error *local_30;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_30 = error;
  iVar2 = (*index->_vptr_S2ShapeIndex[2])();
  if (iVar2 == 0) {
    bVar1 = false;
  }
  else {
    iVar2 = (*index->_vptr_S2ShapeIndex[2])(index);
    if (iVar2 != 1) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_visit_crossing_edge_pairs.cc"
                 ,0x1ab,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_28._8_8_,"Check failed: (1) == (index.num_shape_ids()) ",0x2d);
      abort();
    }
    iVar2 = (*index->_vptr_S2ShapeIndex[3])(index,0);
    local_28._M_unused._M_member_pointer = CONCAT44(extraout_var,iVar2);
    local_28._8_8_ = &local_30;
    pcStack_10 = std::
                 _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&,_const_s2shapeutil::ShapeEdge_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_visit_crossing_edge_pairs.cc:435:7)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&,_const_s2shapeutil::ShapeEdge_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_visit_crossing_edge_pairs.cc:435:7)>
               ::_M_manager;
    bVar1 = VisitCrossings(index,ALL,false,(EdgePairVisitor *)&local_28);
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool FindSelfIntersection(const S2ShapeIndex& index, S2Error* error) {
  if (index.num_shape_ids() == 0) return false;
  S2_DCHECK_EQ(1, index.num_shape_ids());
  const S2Shape& shape = *index.shape(0);

  // Visit all crossing pairs except possibly for ones of the form (AB, BC),
  // since such pairs are very common and FindCrossingError() only needs pairs
  // of the form (AB, AC).
  return !VisitCrossings(
      index, CrossingType::ALL, false /*need_adjacent*/,
      [&](const ShapeEdge& a, const ShapeEdge& b, bool is_interior) {
        return !FindCrossingError(shape, a, b, is_interior, error);
      });
}